

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::DefaultsTest::CompareAndLog
          (DefaultsTest *this,GLint value_ref,GLint value_dst,GLenum pname)

{
  ostringstream *this_00;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  if (value_ref != value_dst) {
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Queried value of pname ",0x17);
    local_1b0.m_getName = glu::getTextureParameterName;
    local_1b0.m_value = pname;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," is equal to ",0xd);
    std::ostream::operator<<(this_00,value_dst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", however ",10);
    std::ostream::operator<<(this_00,value_ref);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," was expected. Test fails.",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
  }
  return value_ref == value_dst;
}

Assistant:

bool DefaultsTest::CompareAndLog(glw::GLint value_ref, glw::GLint value_dst, glw::GLenum pname)
{
	if (value_ref != value_dst)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Queried value of pname "
											<< glu::getTextureParameterStr(pname) << " is equal to " << value_dst
											<< ", however " << value_ref << " was expected. Test fails."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}